

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::PipelineResourceSignatureDescWrapper
          (PipelineResourceSignatureDescWrapper *this,char *PSOName,
          PipelineResourceLayoutDesc *ResourceLayout,Uint32 SRBAllocationGranularity)

{
  long lVar1;
  Uint32 i;
  ulong uVar2;
  
  (this->m_Name)._M_dataplus._M_p = (pointer)&(this->m_Name).field_2;
  (this->m_Name)._M_string_length = 0;
  (this->m_Name).field_2._M_local_buf[0] = '\0';
  (this->m_CombinedSamplerSuffix)._M_dataplus._M_p =
       (pointer)&(this->m_CombinedSamplerSuffix).field_2;
  (this->m_CombinedSamplerSuffix)._M_string_length = 0;
  (this->m_CombinedSamplerSuffix).field_2._M_local_buf[0] = '\0';
  (this->m_Resources).
  super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Resources).
  super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Resources).
  super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ImmutableSamplers).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ImmutableSamplers).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ImmutableSamplers).
  super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_StringPool)._M_h._M_buckets = &(this->m_StringPool)._M_h._M_single_bucket;
  (this->m_StringPool)._M_h._M_bucket_count = 1;
  (this->m_StringPool)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_StringPool)._M_h._M_element_count = 0;
  (this->m_StringPool)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_Desc).ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  *(undefined8 *)((long)&(this->m_Desc).ImmutableSamplers + 6) = 0;
  (this->m_StringPool)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_StringPool)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (Char *)0x0;
  (this->m_Desc).Resources = (PipelineResourceDesc *)0x0;
  (this->m_Desc).NumResources = 0;
  (this->m_Desc).CombinedSamplerSuffix = "_sampler";
  (this->m_Desc).SRBAllocationGranularity = 1;
  if (PSOName != (char *)0x0) {
    std::__cxx11::string::assign((char *)this);
    std::__cxx11::string::append((char *)this);
    std::__cxx11::string::push_back((char)this);
    (this->m_Desc).super_DeviceObjectAttribs.Name = (this->m_Name)._M_dataplus._M_p;
  }
  std::vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
  reserve(&this->m_ImmutableSamplers,(ulong)ResourceLayout->NumImmutableSamplers);
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < ResourceLayout->NumImmutableSamplers; uVar2 = uVar2 + 1) {
    AddImmutableSampler<Diligent::ImmutableSamplerDesc_const&>
              (this,(ImmutableSamplerDesc *)
                    ((long)(ResourceLayout->ImmutableSamplers->Desc).BorderColor + lVar1 + -0x2c));
    lVar1 = lVar1 + 0x48;
  }
  (this->m_Desc).SRBAllocationGranularity = SRBAllocationGranularity;
  return;
}

Assistant:

PipelineResourceSignatureDescWrapper(const char*                       PSOName,
                                         const PipelineResourceLayoutDesc& ResourceLayout,
                                         Uint32                            SRBAllocationGranularity)
    {
        if (PSOName != nullptr)
        {
            m_Name = "Implicit signature of PSO '";
            m_Name += PSOName;
            m_Name += '\'';
            m_Desc.Name = m_Name.c_str();
        }

        m_ImmutableSamplers.reserve(ResourceLayout.NumImmutableSamplers);
        for (Uint32 i = 0; i < ResourceLayout.NumImmutableSamplers; ++i)
            AddImmutableSampler(ResourceLayout.ImmutableSamplers[i]);

        m_Desc.SRBAllocationGranularity = SRBAllocationGranularity;
    }